

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

bool __thiscall
duckdb::VectorOfValuesEquality::operator()
          (VectorOfValuesEquality *this,vector<duckdb::Value,_true> *a,
          vector<duckdb::Value,_true> *b)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  const_reference left;
  const_reference right;
  size_type __n;
  
  pVVar1 = (a->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (a->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar2 - (long)pVVar1 ==
      (long)(b->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(b->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (pVVar2 == pVVar1) {
      bVar3 = true;
    }
    else {
      __n = 0;
      do {
        left = vector<duckdb::Value,_true>::operator[](a,__n);
        right = vector<duckdb::Value,_true>::operator[](b,__n);
        bVar3 = ValueOperations::DistinctFrom(left,right);
        if (bVar3) break;
        __n = __n + 1;
      } while (__n < (ulong)((long)(a->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(a->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
      bVar3 = !bVar3;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator()(const vector<Value> &a, const vector<Value> &b) const {
		if (a.size() != b.size()) {
			return false;
		}
		for (idx_t i = 0; i < a.size(); i++) {
			if (ValueOperations::DistinctFrom(a[i], b[i])) {
				return false;
			}
		}
		return true;
	}